

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliperMetadataAccessInterface.cpp
# Opt level: O2

vector<cali::Attribute,_std::allocator<cali::Attribute>_> * __thiscall
cali::CaliperMetadataAccessInterface::find_attributes_with_prop
          (vector<cali::Attribute,_std::allocator<cali::Attribute>_> *__return_storage_ptr__,
          CaliperMetadataAccessInterface *this,int prop)

{
  uint uVar1;
  pointer pAVar2;
  Attribute attr;
  vector<cali::Attribute,_std::allocator<cali::Attribute>_> vec;
  Attribute local_48;
  _Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_> local_40;
  
  (*this->_vptr_CaliperMetadataAccessInterface[3])(&local_40);
  (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pAVar2 = local_40._M_impl.super__Vector_impl_data._M_start;
      pAVar2 != local_40._M_impl.super__Vector_impl_data._M_finish; pAVar2 = pAVar2 + 1) {
    local_48.m_node = pAVar2->m_node;
    uVar1 = Attribute::properties(&local_48);
    if ((uVar1 & prop) != 0) {
      std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::push_back
                (__return_storage_ptr__,&local_48);
    }
  }
  std::_Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Attribute> CaliperMetadataAccessInterface::find_attributes_with_prop(int prop) const
{
    std::vector<Attribute> vec = get_all_attributes();
    std::vector<Attribute> ret;

    for (Attribute attr : vec)
        if (attr.properties() & prop)
            ret.push_back(attr);

    return ret;
}